

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::Flower::filterDataContents
          (Flower *this,PossibleContents *contents,DataLocation *dataLoc)

{
  bool bVar1;
  uint uVar2;
  int32_t init;
  Field *pFVar3;
  Type type;
  PossibleContents local_f8;
  Literal local_d8;
  Literal local_c0;
  PossibleContents local_a8;
  undefined1 local_88 [8];
  Literal mask;
  PossibleContents local_60;
  uintptr_t local_40;
  undefined1 local_38 [8];
  optional<wasm::Field> field;
  DataLocation *dataLoc_local;
  PossibleContents *contents_local;
  Flower *this_local;
  
  local_40 = (dataLoc->type).id;
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._16_8_ = dataLoc;
  GCTypeUtils::getField((optional<wasm::Field> *)local_38,(HeapType)local_40,dataLoc->index);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
  if (bVar1) {
    pFVar3 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_38);
    bVar1 = Field::isPacked(pFVar3);
    if (bVar1) {
      bVar1 = PossibleContents::isLiteral(contents);
      if (bVar1) {
        pFVar3 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_38);
        uVar2 = Field::getByteSize(pFVar3);
        init = Bits::lowBitMask(uVar2 << 3);
        wasm::Literal::Literal((Literal *)local_88,init);
        PossibleContents::getLiteral(&local_d8,contents);
        wasm::Literal::and_(&local_c0,&local_d8,(Literal *)local_88);
        PossibleContents::literal(&local_a8,&local_c0);
        PossibleContents::operator=(contents,&local_a8);
        PossibleContents::~PossibleContents(&local_a8);
        wasm::Literal::~Literal(&local_c0);
        wasm::Literal::~Literal(&local_d8);
        wasm::Literal::~Literal((Literal *)local_88);
      }
      else {
        type = PossibleContents::getType(contents);
        PossibleContents::fromType(&local_f8,type);
        PossibleContents::operator=(contents,&local_f8);
        PossibleContents::~PossibleContents(&local_f8);
      }
    }
  }
  else {
    bVar1 = HeapType::isBottom((HeapType *)
                               field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Field>._16_8_);
    if (!bVar1) {
      __assert_fail("dataLoc.type.isBottom()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                    ,0xae5,
                    "void wasm::(anonymous namespace)::Flower::filterDataContents(PossibleContents &, const DataLocation &)"
                   );
    }
    PossibleContents::none();
    PossibleContents::operator=(contents,&local_60);
    PossibleContents::~PossibleContents(&local_60);
  }
  return;
}

Assistant:

void Flower::filterDataContents(PossibleContents& contents,
                                const DataLocation& dataLoc) {
  auto field = GCTypeUtils::getField(dataLoc.type, dataLoc.index);
  if (!field) {
    // This is a bottom type; nothing will be written here.
    assert(dataLoc.type.isBottom());
    contents = PossibleContents::none();
    return;
  }

  if (field->isPacked()) {
    // We must handle packed fields carefully.
    if (contents.isLiteral()) {
      // This is a constant. We can truncate it and use that value.
      auto mask = Literal(int32_t(Bits::lowBitMask(field->getByteSize() * 8)));
      contents = PossibleContents::literal(contents.getLiteral().and_(mask));
    } else {
      // This is not a constant. We can't even handle a global here, as we'd
      // need to track that this global's value must be truncated before it is
      // used, and we don't do that atm. Leave only the type.
      // TODO Consider tracking packing on GlobalInfo alongside the type.
      //      Another option is to make GUFA.cpp apply packing on the read,
      //      like CFP does - but that can only be done when replacing a
      //      StructGet of a packed field, and not anywhere else we saw that
      //      value reach.
      contents = PossibleContents::fromType(contents.getType());
    }
    // Given that the above only (1) turns an i32 into a masked i32 or (2) turns
    // anything else into an unknown i32, this is safe to run as pre-filtering,
    // that is, before we combine contents, since
    //
    //  (a) two constants are ok as masking is distributive,
    //        (x & M) U (y & M)  ==  (x U y) & M
    //  (b) if one is a constant and the other is not then
    //        (x & M) U ?  ==  ?  ==  (x U ?)  ==  (x U ?) & M
    //      (where ? is an unknown i32)
    //  (c) and if both are not constants then likewise we always end up as an
    //      unknown i32
    //
  }
}